

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

wostream * Centaurus::operator<<(wostream *os,ATNPath *path)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  wostream *pwVar4;
  uint local_1c;
  uint i;
  ATNPath *path_local;
  wostream *os_local;
  
  bVar1 = std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::empty(&path->
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
  if (!bVar1) {
    local_1c = 0;
    while( true ) {
      sVar2 = std::
              vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
              ::size(&path->
                      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                    );
      if (sVar2 - 1 <= (ulong)local_1c) break;
      pvVar3 = std::
               vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ::operator[](&path->
                             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ,(ulong)local_1c);
      pwVar4 = operator<<(os,&pvVar3->first);
      pwVar4 = std::operator<<(pwVar4,L'.');
      pvVar3 = std::
               vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ::operator[](&path->
                             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ,(ulong)local_1c);
      pwVar4 = (wostream *)std::wostream::operator<<(pwVar4,pvVar3->second);
      std::operator<<(pwVar4,L'/');
      local_1c = local_1c + 1;
    }
    pvVar3 = std::
             vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ::back(&path->
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   );
    pwVar4 = operator<<(os,&pvVar3->first);
    pwVar4 = std::operator<<(pwVar4,L'.');
    pvVar3 = std::
             vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             ::back(&path->
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   );
    std::wostream::operator<<(pwVar4,pvVar3->second);
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const ATNPath& path)
{
	if (!path.empty())
	{
		for (unsigned int i = 0; i < path.size() - 1; i++)
		{
			os << path[i].first << L'.' << path[i].second << L'/';
		}
		os << path.back().first << L'.' << path.back().second;
	}
	return os;
}